

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O2

void ImGui_ImplOpenGL3_RenderDrawData(ImDrawData *draw_data)

{
  undefined4 uVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  undefined4 uVar4;
  ImDrawList *this;
  ImDrawCallback p_Var5;
  undefined1 auVar6 [16];
  GLvoid *pGVar7;
  GLboolean GVar8;
  GLboolean GVar9;
  GLboolean GVar10;
  GLboolean GVar11;
  GLboolean GVar12;
  GLboolean GVar13;
  undefined4 in_EAX;
  int iVar14;
  uint uVar15;
  ImDrawCmd *pIVar16;
  PFNGLENABLEPROC *pp_Var17;
  long lVar18;
  PFNGLENABLEPROC *pp_Var19;
  int cmd_i;
  int iVar20;
  float fVar21;
  float fVar23;
  undefined1 auVar22 [16];
  float fVar24;
  float fVar25;
  int iVar26;
  int iVar27;
  float fVar28;
  GLuint vertex_array_object;
  GLuint last_sampler;
  PFNGLDISABLEPROC *local_100;
  GLenum last_blend_equation_alpha;
  GLenum last_blend_equation_rgb;
  GLenum last_blend_dst_alpha;
  GLenum last_blend_src_alpha;
  GLenum last_blend_dst_rgb;
  GLenum last_blend_src_rgb;
  GLuint last_vertex_array_object;
  GLuint last_array_buffer;
  GLuint last_texture;
  GLuint last_program;
  GLenum last_active_texture;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  GLint last_polygon_mode [2];
  float local_78;
  float local_68;
  
  iVar26 = (int)((draw_data->FramebufferScale).x * (draw_data->DisplaySize).x);
  iVar27 = (int)((draw_data->FramebufferScale).y * (draw_data->DisplaySize).y);
  auVar22._0_4_ = -(uint)(0 < iVar26);
  auVar22._4_4_ = -(uint)(0 < iVar26);
  auVar22._8_4_ = -(uint)(0 < iVar27);
  auVar22._12_4_ = -(uint)(0 < iVar27);
  iVar14 = movmskpd(in_EAX,auVar22);
  if (iVar14 == 3) {
    local_b8 = CONCAT44(iVar27,iVar26);
    uStack_b0 = 0;
    (*gl3wGetIntegerv)(0x84e0,(GLint *)&last_active_texture);
    (*gl3wActiveTexture)(0x84c0);
    (*gl3wGetIntegerv)(0x8b8d,(GLint *)&last_program);
    (*gl3wGetIntegerv)(0x8069,(GLint *)&last_texture);
    if (g_GlVersion < 0x14a) {
      last_sampler = 0;
    }
    else {
      (*gl3wGetIntegerv)(0x8919,(GLint *)&last_sampler);
    }
    (*gl3wGetIntegerv)(0x8894,(GLint *)&last_array_buffer);
    (*gl3wGetIntegerv)(0x85b5,(GLint *)&last_vertex_array_object);
    (*gl3wGetIntegerv)(0xb40,last_polygon_mode);
    (*gl3wGetIntegerv)(0xba2,last_viewport);
    (*gl3wGetIntegerv)(0xc10,last_scissor_box);
    (*gl3wGetIntegerv)(0x80c9,(GLint *)&last_blend_src_rgb);
    (*gl3wGetIntegerv)(0x80c8,(GLint *)&last_blend_dst_rgb);
    (*gl3wGetIntegerv)(0x80cb,(GLint *)&last_blend_src_alpha);
    (*gl3wGetIntegerv)(0x80ca,(GLint *)&last_blend_dst_alpha);
    (*gl3wGetIntegerv)(0x8009,(GLint *)&last_blend_equation_rgb);
    (*gl3wGetIntegerv)(0x883d,(GLint *)&last_blend_equation_alpha);
    GVar8 = (*gl3wIsEnabled)(0xbe2);
    GVar9 = (*gl3wIsEnabled)(0xb44);
    GVar10 = (*gl3wIsEnabled)(0xb71);
    GVar11 = (*gl3wIsEnabled)(0xb90);
    GVar12 = (*gl3wIsEnabled)(0xc11);
    if ((g_GlVersion < 0x136) || (GVar13 = (*gl3wIsEnabled)(0x8f9d), GVar13 == '\0')) {
      local_100 = &gl3wDisable;
    }
    else {
      local_100 = &gl3wEnable;
    }
    vertex_array_object = 0;
    (*gl3wGenVertexArrays)(1,&vertex_array_object);
    iVar14 = (int)(float)local_b8;
    iVar26 = local_b8._4_4_;
    local_c8 = (float)local_b8._4_4_;
    fStack_c4 = (float)local_b8._4_4_;
    fStack_c0 = (float)local_b8._4_4_;
    fStack_bc = (float)local_b8._4_4_;
    ImGui_ImplOpenGL3_SetupRenderState
              (draw_data,(int)(float)local_b8,local_b8._4_4_,vertex_array_object);
    IVar2 = draw_data->DisplayPos;
    IVar3 = draw_data->FramebufferScale;
    fVar25 = IVar3.y;
    fVar23 = IVar2.y;
    local_b8 = CONCAT44((float)local_b8._4_4_,(float)(int)(float)local_b8);
    uStack_b0 = CONCAT44((float)uStack_b0._4_4_,(float)(int)uStack_b0);
    local_c8 = (float)(int)local_c8;
    fStack_c4 = (float)(int)fStack_c4;
    fStack_c0 = (float)(int)fStack_c0;
    fStack_bc = (float)(int)fStack_bc;
    for (lVar18 = 0; lVar18 < draw_data->CmdListsCount; lVar18 = lVar18 + 1) {
      this = draw_data->CmdLists[lVar18];
      (*gl3wBufferData)(0x8892,(long)(this->VtxBuffer).Size * 0x14,(this->VtxBuffer).Data,0x88e0);
      (*gl3wBufferData)(0x8893,(long)(this->IdxBuffer).Size * 2,(this->IdxBuffer).Data,0x88e0);
      for (iVar27 = 0; iVar27 < (this->CmdBuffer).Size; iVar27 = iVar27 + 1) {
        pIVar16 = ImVector<ImDrawCmd>::operator[](&this->CmdBuffer,iVar27);
        p_Var5 = pIVar16->UserCallback;
        if (p_Var5 == (ImDrawCallback)0x0) {
          local_68 = IVar2.x;
          local_78 = IVar3.x;
          fVar21 = ((pIVar16->ClipRect).x - local_68) * local_78;
          if ((fVar21 < (float)local_b8) &&
             (fVar24 = ((pIVar16->ClipRect).y - fVar23) * fVar25, fVar24 < local_c8)) {
            uVar1 = (pIVar16->ClipRect).z;
            uVar4 = (pIVar16->ClipRect).w;
            local_78 = ((float)uVar1 - local_68) * local_78;
            fVar28 = ((float)uVar4 - fVar23) * fVar25;
            iVar20 = -(uint)(0.0 <= local_78);
            auVar6._4_4_ = iVar20;
            auVar6._0_4_ = iVar20;
            auVar6._8_4_ = -(uint)(0.0 <= fVar28);
            auVar6._12_4_ = -(uint)(0.0 <= fVar28);
            uVar15 = movmskpd(0,auVar6);
            if (((uVar15 & 1) != 0) && ((byte)((byte)uVar15 >> 1) != 0)) {
              (*gl3wScissor)((int)fVar21,(int)(local_c8 - fVar28),(int)(local_78 - fVar21),
                             (int)(fVar28 - fVar24));
              (*gl3wBindTexture)(0xde1,*(GLuint *)&pIVar16->TextureId);
              pGVar7 = (GLvoid *)((ulong)pIVar16->IdxOffset * 2);
              if (g_GlVersion < 0x140) {
                (*gl3wDrawElements)(4,pIVar16->ElemCount,0x1403,pGVar7);
              }
              else {
                (*gl3wDrawElementsBaseVertex)(4,pIVar16->ElemCount,0x1403,pGVar7,pIVar16->VtxOffset)
                ;
              }
            }
          }
        }
        else if (p_Var5 == (ImDrawCallback)0xffffffffffffffff) {
          ImGui_ImplOpenGL3_SetupRenderState(draw_data,iVar14,iVar26,vertex_array_object);
        }
        else {
          (*p_Var5)(this,pIVar16);
        }
      }
    }
    (*gl3wDeleteVertexArrays)(1,&vertex_array_object);
    (*gl3wUseProgram)(last_program);
    (*gl3wBindTexture)(0xde1,last_texture);
    if (0x149 < g_GlVersion) {
      (*gl3wBindSampler)(0,last_sampler);
    }
    (*gl3wActiveTexture)(last_active_texture);
    (*gl3wBindVertexArray)(last_vertex_array_object);
    (*gl3wBindBuffer)(0x8892,last_array_buffer);
    (*gl3wBlendEquationSeparate)(last_blend_equation_rgb,last_blend_equation_alpha);
    (*gl3wBlendFuncSeparate)
              (last_blend_src_rgb,last_blend_dst_rgb,last_blend_src_alpha,last_blend_dst_alpha);
    pp_Var19 = &gl3wEnable;
    pp_Var17 = &gl3wEnable;
    if (GVar8 == '\0') {
      pp_Var17 = &gl3wDisable;
    }
    (**pp_Var17)(0xbe2);
    pp_Var17 = &gl3wEnable;
    if (GVar9 == '\0') {
      pp_Var17 = &gl3wDisable;
    }
    (**pp_Var17)(0xb44);
    pp_Var17 = &gl3wEnable;
    if (GVar10 == '\0') {
      pp_Var17 = &gl3wDisable;
    }
    (**pp_Var17)(0xb71);
    pp_Var17 = &gl3wEnable;
    if (GVar11 == '\0') {
      pp_Var17 = &gl3wDisable;
    }
    (**pp_Var17)(0xb90);
    if (GVar12 == '\0') {
      pp_Var19 = &gl3wDisable;
    }
    (**pp_Var19)(0xc11);
    if (0x135 < g_GlVersion) {
      (**local_100)(0x8f9d);
    }
    (*gl3wPolygonMode)(0x408,last_polygon_mode[0]);
    (*gl3wViewport)(last_viewport[0],last_viewport[1],last_viewport[2],last_viewport[3]);
    (*gl3wScissor)(last_scissor_box[0],last_scissor_box[1],last_scissor_box[2],last_scissor_box[3]);
    return;
  }
  return;
}

Assistant:

void    ImGui_ImplOpenGL3_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width <= 0 || fb_height <= 0)
        return;

    // Backup GL state
    GLenum last_active_texture; glGetIntegerv(GL_ACTIVE_TEXTURE, (GLint*)&last_active_texture);
    glActiveTexture(GL_TEXTURE0);
    GLuint last_program; glGetIntegerv(GL_CURRENT_PROGRAM, (GLint*)&last_program);
    GLuint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, (GLint*)&last_texture);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_BIND_SAMPLER
    GLuint last_sampler; if (g_GlVersion >= 330) { glGetIntegerv(GL_SAMPLER_BINDING, (GLint*)&last_sampler); } else { last_sampler = 0; }
#endif
    GLuint last_array_buffer; glGetIntegerv(GL_ARRAY_BUFFER_BINDING, (GLint*)&last_array_buffer);
#ifndef IMGUI_IMPL_OPENGL_ES2
    GLuint last_vertex_array_object; glGetIntegerv(GL_VERTEX_ARRAY_BINDING, (GLint*)&last_vertex_array_object);
#endif
#ifdef GL_POLYGON_MODE
    GLint last_polygon_mode[2]; glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
#endif
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLenum last_blend_src_rgb; glGetIntegerv(GL_BLEND_SRC_RGB, (GLint*)&last_blend_src_rgb);
    GLenum last_blend_dst_rgb; glGetIntegerv(GL_BLEND_DST_RGB, (GLint*)&last_blend_dst_rgb);
    GLenum last_blend_src_alpha; glGetIntegerv(GL_BLEND_SRC_ALPHA, (GLint*)&last_blend_src_alpha);
    GLenum last_blend_dst_alpha; glGetIntegerv(GL_BLEND_DST_ALPHA, (GLint*)&last_blend_dst_alpha);
    GLenum last_blend_equation_rgb; glGetIntegerv(GL_BLEND_EQUATION_RGB, (GLint*)&last_blend_equation_rgb);
    GLenum last_blend_equation_alpha; glGetIntegerv(GL_BLEND_EQUATION_ALPHA, (GLint*)&last_blend_equation_alpha);
    GLboolean last_enable_blend = glIsEnabled(GL_BLEND);
    GLboolean last_enable_cull_face = glIsEnabled(GL_CULL_FACE);
    GLboolean last_enable_depth_test = glIsEnabled(GL_DEPTH_TEST);
    GLboolean last_enable_stencil_test = glIsEnabled(GL_STENCIL_TEST);
    GLboolean last_enable_scissor_test = glIsEnabled(GL_SCISSOR_TEST);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_PRIMITIVE_RESTART
    GLboolean last_enable_primitive_restart = (g_GlVersion >= 310) ? glIsEnabled(GL_PRIMITIVE_RESTART) : GL_FALSE;
#endif

    // Setup desired GL state
    // Recreate the VAO every time (this is to easily allow multiple GL contexts to be rendered to. VAO are not shared among GL contexts)
    // The renderer would actually work without any VAO bound, but then our VertexAttrib calls would overwrite the default one currently bound.
    GLuint vertex_array_object = 0;
#ifndef IMGUI_IMPL_OPENGL_ES2
    glGenVertexArrays(1, &vertex_array_object);
#endif
    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];

        // Upload vertex/index buffers
        glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)cmd_list->VtxBuffer.Size * (int)sizeof(ImDrawVert), (const GLvoid*)cmd_list->VtxBuffer.Data, GL_STREAM_DRAW);
        glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)cmd_list->IdxBuffer.Size * (int)sizeof(ImDrawIdx), (const GLvoid*)cmd_list->IdxBuffer.Data, GL_STREAM_DRAW);

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback != NULL)
            {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f && clip_rect.w >= 0.0f)
                {
                    // Apply scissor/clipping rectangle
                    glScissor((int)clip_rect.x, (int)(fb_height - clip_rect.w), (int)(clip_rect.z - clip_rect.x), (int)(clip_rect.w - clip_rect.y));

                    // Bind texture, Draw
                    glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->TextureId);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_VTX_OFFSET
                    if (g_GlVersion >= 320)
                        glDrawElementsBaseVertex(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)), (GLint)pcmd->VtxOffset);
                    else
#endif
                    glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)));
                }
            }
        }
    }

    // Destroy the temporary VAO
#ifndef IMGUI_IMPL_OPENGL_ES2
    glDeleteVertexArrays(1, &vertex_array_object);
#endif

    // Restore modified GL state
    glUseProgram(last_program);
    glBindTexture(GL_TEXTURE_2D, last_texture);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_BIND_SAMPLER
    if (g_GlVersion >= 330)
        glBindSampler(0, last_sampler);
#endif
    glActiveTexture(last_active_texture);
#ifndef IMGUI_IMPL_OPENGL_ES2
    glBindVertexArray(last_vertex_array_object);
#endif
    glBindBuffer(GL_ARRAY_BUFFER, last_array_buffer);
    glBlendEquationSeparate(last_blend_equation_rgb, last_blend_equation_alpha);
    glBlendFuncSeparate(last_blend_src_rgb, last_blend_dst_rgb, last_blend_src_alpha, last_blend_dst_alpha);
    if (last_enable_blend) glEnable(GL_BLEND); else glDisable(GL_BLEND);
    if (last_enable_cull_face) glEnable(GL_CULL_FACE); else glDisable(GL_CULL_FACE);
    if (last_enable_depth_test) glEnable(GL_DEPTH_TEST); else glDisable(GL_DEPTH_TEST);
    if (last_enable_stencil_test) glEnable(GL_STENCIL_TEST); else glDisable(GL_STENCIL_TEST);
    if (last_enable_scissor_test) glEnable(GL_SCISSOR_TEST); else glDisable(GL_SCISSOR_TEST);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_PRIMITIVE_RESTART
    if (g_GlVersion >= 310) { if (last_enable_primitive_restart) glEnable(GL_PRIMITIVE_RESTART); else glDisable(GL_PRIMITIVE_RESTART); }
#endif

#ifdef GL_POLYGON_MODE
    glPolygonMode(GL_FRONT_AND_BACK, (GLenum)last_polygon_mode[0]);
#endif
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
}